

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O2

int __thiscall GPIOClass::unexport_gpio(GPIOClass *this)

{
  ostream *poVar1;
  int iVar2;
  string unexport_str;
  ofstream unexportgpio;
  byte abStack_1f0 [480];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&unexport_str,"/sys/class/gpio/unexport",(allocator<char> *)&unexportgpio);
  std::ofstream::ofstream(&unexportgpio,unexport_str._M_dataplus._M_p,_S_out);
  if ((abStack_1f0[*(long *)(_unexportgpio + -0x18)] & 5) == 0) {
    std::operator<<((ostream *)&unexportgpio,(string *)this);
    iVar2 = 0;
    std::ofstream::close();
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout," OPERATION FAILED: Unable to unexport GPIO");
    poVar1 = std::operator<<(poVar1,(string *)this);
    poVar1 = std::operator<<(poVar1," .");
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = -1;
  }
  std::ofstream::~ofstream(&unexportgpio);
  std::__cxx11::string::~string((string *)&unexport_str);
  return iVar2;
}

Assistant:

int GPIOClass::unexport_gpio()
{
    string unexport_str = "/sys/class/gpio/unexport";
    ofstream unexportgpio(unexport_str.c_str()); //Open unexport file
    if (!unexportgpio){
        cout << " OPERATION FAILED: Unable to unexport GPIO"<< this->gpionum <<" ."<< endl;
        return -1;
    }

    unexportgpio << this->gpionum ; //write GPIO number to unexport
    unexportgpio.close(); //close unexport file
    return 0;
}